

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<double,long,duckdb::ArgMinMaxState<double,long>>
               (ArgMinMaxState<double,_long> *state,double x_data,long y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  long *in_RDX;
  TemplatedValidityMask<unsigned_long> *in_RSI;
  undefined8 in_RDI;
  undefined1 x_null;
  ArgMinMaxState<double,_long> *in_XMM0_Qa;
  long *in_stack_ffffffffffffffd8;
  
  x_null = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDX);
  if ((bVar1) && (bVar1 = LessThan::Operation<long>(in_RDX,in_stack_ffffffffffffffd8), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDX);
    Assign<double,long,duckdb::ArgMinMaxState<double,long>>
              (in_XMM0_Qa,(double *)in_RSI,in_RDX,(bool)x_null);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}